

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_resetCStream(ZSTD_CStream *zcs,unsigned_long_long pledgedSrcSize)

{
  ZSTD_CDict *cdict;
  size_t sVar1;
  long lVar2;
  ZSTD_CCtx_params *pZVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ZSTD_CCtx_params params;
  ZSTD_CCtx_params in_stack_fffffffffffffef8;
  undefined8 local_80 [4];
  undefined4 local_60;
  
  pZVar3 = &zcs->requestedParams;
  puVar4 = local_80;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pZVar3;
    pZVar3 = (ZSTD_CCtx_params *)&(pZVar3->cParams).chainLog;
    puVar4 = puVar4 + 1;
  }
  local_60 = 1;
  cdict = zcs->cdict;
  puVar4 = local_80;
  puVar5 = (undefined8 *)&stack0xfffffffffffffef8;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + 1;
    puVar5 = puVar5 + 1;
  }
  sVar1 = ZSTD_resetCStream_internal
                    (zcs,(void *)0x0,0,ZSTD_dct_auto,cdict,in_stack_fffffffffffffef8,
                     -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize);
  return sVar1;
}

Assistant:

size_t ZSTD_resetCStream(ZSTD_CStream* zcs, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params params = zcs->requestedParams;
    DEBUGLOG(4, "ZSTD_resetCStream: pledgedSrcSize = %u", (unsigned)pledgedSrcSize);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    params.fParams.contentSizeFlag = 1;
    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}